

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

void __thiscall gvr::Mesh::resizeTriangleList(Mesh *this,int tn)

{
  uint *puVar1;
  int iVar2;
  uint *puVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < tn) {
    uVar4 = (long)(tn * 3) << 2;
  }
  puVar3 = (uint *)operator_new__(uVar4);
  iVar2 = this->n;
  if (tn <= this->n) {
    iVar2 = tn;
  }
  puVar1 = this->triangle;
  for (uVar4 = (ulong)(uint)(iVar2 * 3); 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    puVar3[uVar4 - 1] = puVar1[uVar4 - 1];
  }
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  this->triangle = puVar3;
  this->n = tn;
  return;
}

Assistant:

void Mesh::resizeTriangleList(int tn)
{
  unsigned int *p=new unsigned int [3*tn];

  for (int i=3*std::min(n, tn)-1; i>=0; i--)
  {
    p[i]=triangle[i];
  }

  delete [] triangle;

  triangle=p;
  n=tn;
}